

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int updatewindow(z_streamp strm,Bytef *end,uint copy)

{
  internal_state *piVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  voidpf pvVar5;
  uint local_34;
  uint dist;
  inflate_state *state;
  uint copy_local;
  Bytef *end_local;
  z_streamp strm_local;
  
  piVar1 = strm->state;
  lVar2._0_1_ = piVar1->method;
  lVar2._1_3_ = *(undefined3 *)&piVar1->field_0x49;
  lVar2._4_4_ = piVar1->last_flush;
  if (lVar2 == 0) {
    pvVar5 = (*strm->zalloc)(strm->opaque,1 << ((byte)*(undefined4 *)&piVar1->gzhead & 0x1f),1);
    *(voidpf *)&piVar1->method = pvVar5;
    lVar3._0_1_ = piVar1->method;
    lVar3._1_3_ = *(undefined3 *)&piVar1->field_0x49;
    lVar3._4_4_ = piVar1->last_flush;
    if (lVar3 == 0) {
      return 1;
    }
  }
  if (*(int *)((long)&piVar1->gzhead + 4) == 0) {
    *(int *)((long)&piVar1->gzhead + 4) = 1 << ((byte)*(undefined4 *)&piVar1->gzhead & 0x1f);
    *(undefined4 *)((long)&piVar1->gzindex + 4) = 0;
    *(undefined4 *)&piVar1->gzindex = 0;
  }
  if (copy < *(uint *)((long)&piVar1->gzhead + 4)) {
    local_34 = *(int *)((long)&piVar1->gzhead + 4) - *(int *)((long)&piVar1->gzindex + 4);
    if (copy < local_34) {
      local_34 = copy;
    }
    memcpy((void *)(*(long *)&piVar1->method + (ulong)*(uint *)((long)&piVar1->gzindex + 4)),
           end + -(ulong)copy,(ulong)local_34);
    uVar4 = copy - local_34;
    if (uVar4 == 0) {
      *(uint *)((long)&piVar1->gzindex + 4) = local_34 + *(int *)((long)&piVar1->gzindex + 4);
      if (*(int *)((long)&piVar1->gzindex + 4) == *(int *)((long)&piVar1->gzhead + 4)) {
        *(undefined4 *)((long)&piVar1->gzindex + 4) = 0;
      }
      if ((uint)piVar1->gzindex < *(uint *)((long)&piVar1->gzhead + 4)) {
        *(uint *)&piVar1->gzindex = local_34 + (int)piVar1->gzindex;
      }
    }
    else {
      memcpy(*(void **)&piVar1->method,end + -(ulong)uVar4,(ulong)uVar4);
      *(uint *)((long)&piVar1->gzindex + 4) = uVar4;
      *(undefined4 *)&piVar1->gzindex = *(undefined4 *)((long)&piVar1->gzhead + 4);
    }
  }
  else {
    memcpy(*(void **)&piVar1->method,end + -(ulong)*(uint *)((long)&piVar1->gzhead + 4),
           (ulong)*(uint *)((long)&piVar1->gzhead + 4));
    *(undefined4 *)((long)&piVar1->gzindex + 4) = 0;
    *(undefined4 *)&piVar1->gzindex = *(undefined4 *)((long)&piVar1->gzhead + 4);
  }
  return 0;
}

Assistant:

local int updatewindow(strm, end, copy)
z_streamp strm;
const Bytef *end;
unsigned copy;
{
    struct inflate_state FAR *state;
    unsigned dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    if (copy >= state->wsize) {
        zmemcpy(state->window, end - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, end - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, end - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}